

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget,QTouchEvent *touchEvent)

{
  char cVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QPointF QVar5;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(touchEvent + 0x38) == 0) {
    bVar3 = false;
  }
  else {
    uVar4 = 0;
    bVar3 = false;
    do {
      plVar2 = (long *)QPointerEvent::point((longlong)touchEvent);
      local_48.xp = (qreal)QEventPoint::globalPosition();
      local_48.yp = in_XMM1_Qa;
      QVar5 = QWidget::mapFromGlobal(widget,&local_48);
      in_XMM1_Qa = QVar5.yp;
      *(QPointF *)(*plVar2 + 0x30) = QVar5;
      cVar1 = QEventPoint::state();
      bVar3 = (bool)(bVar3 | cVar1 == '\x01');
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)(touchEvent + 0x38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget, QTouchEvent *touchEvent)
{
    bool containsPress = false;

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, widget->mapFromGlobal(pt.globalPosition()));

        if (pt.state() == QEventPoint::State::Pressed)
            containsPress = true;
    }
    return containsPress;
}